

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::ExtensionRangeOptions_Declaration::ByteSizeLong
          (ExtensionRangeOptions_Declaration *this)

{
  uint uVar1;
  int32_t value;
  uint32_t *puVar2;
  string *psVar3;
  size_t sVar4;
  size_t sStack_28;
  uint32_t cached_has_bits;
  size_t total_size;
  ExtensionRangeOptions_Declaration *this_;
  ExtensionRangeOptions_Declaration *this_local;
  
  sStack_28 = 0;
  puVar2 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar2;
  if ((uVar1 & 0x1f) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar3 = _internal_full_name_abi_cxx11_(this);
      sStack_28 = internal::WireFormatLite::StringSize(psVar3);
      sStack_28 = sStack_28 + 1;
    }
    if ((uVar1 & 2) != 0) {
      psVar3 = _internal_type_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar3);
      sStack_28 = sVar4 + 1 + sStack_28;
    }
    if ((uVar1 & 4) != 0) {
      value = _internal_number(this);
      sVar4 = internal::WireFormatLite::Int32SizePlusOne(value);
      sStack_28 = sVar4 + sStack_28;
    }
    if ((uVar1 & 8) != 0) {
      sStack_28 = sStack_28 + 2;
    }
    if ((uVar1 & 0x10) != 0) {
      sStack_28 = sStack_28 + 2;
    }
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_28,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t ExtensionRangeOptions_Declaration::ByteSizeLong() const {
          const ExtensionRangeOptions_Declaration& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          // @@protoc_insertion_point(message_byte_size_start:google.protobuf.ExtensionRangeOptions.Declaration)
          ::size_t total_size = 0;

          ::uint32_t cached_has_bits = 0;
          // Prevent compiler warnings about cached_has_bits being unused
          (void)cached_has_bits;

          ::_pbi::Prefetch5LinesFrom7Lines(&this_);
          cached_has_bits = this_._impl_._has_bits_[0];
          if (cached_has_bits & 0x0000001fu) {
            // optional string full_name = 2;
            if (cached_has_bits & 0x00000001u) {
              total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                              this_._internal_full_name());
            }
            // optional string type = 3;
            if (cached_has_bits & 0x00000002u) {
              total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                              this_._internal_type());
            }
            // optional int32 number = 1;
            if (cached_has_bits & 0x00000004u) {
              total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
                  this_._internal_number());
            }
            // optional bool reserved = 5;
            if (cached_has_bits & 0x00000008u) {
              total_size += 2;
            }
            // optional bool repeated = 6;
            if (cached_has_bits & 0x00000010u) {
              total_size += 2;
            }
          }
          return this_.MaybeComputeUnknownFieldsSize(total_size,
                                                     &this_._impl_._cached_size_);
        }